

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise.cpp
# Opt level: O2

Vector3f pbrt::DNoise(Point3f p)

{
  float fVar1;
  undefined1 auVar2 [16];
  pbrt *in_RDI;
  undefined1 auVar3 [16];
  Float FVar4;
  Float FVar5;
  Float FVar6;
  Float FVar7;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar8 [16];
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  Point3f p_00;
  Point3f p_01;
  Point3f p_02;
  Vector3f VVar11;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_38;
  undefined4 extraout_XMM0_Db;
  
  auVar9._8_56_ = p._8_56_;
  auVar9._0_8_ = p.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar3 = vmovshdup_avx(auVar9._0_16_);
  FVar4 = Noise(in_RDI,p);
  fVar1 = p.super_Tuple3<pbrt::Point3,_float>.z + 0.0;
  local_68 = p.super_Tuple3<pbrt::Point3,_float>.x;
  uStack_64 = p.super_Tuple3<pbrt::Point3,_float>.y;
  uStack_60 = p.super_Tuple3<pbrt::Point3,_float>.z;
  uStack_5c = p._12_4_;
  p_00.super_Tuple3<pbrt::Point3,_float>.z = fVar1;
  p_00.super_Tuple3<pbrt::Point3,_float>.x = local_68 + 0.01;
  p_00.super_Tuple3<pbrt::Point3,_float>.y = uStack_64 + 0.0;
  FVar5 = Noise(in_RDI,p_00);
  local_38 = auVar3._0_4_;
  auVar3 = vinsertps_avx(ZEXT416((uint)(local_68 + 0.0)),ZEXT416((uint)(local_38 + 0.01)),0x10);
  p_01.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar3._0_8_;
  p_01.super_Tuple3<pbrt::Point3,_float>.z = fVar1;
  FVar6 = Noise(in_RDI,p_01);
  auVar8._4_12_ =
       SUB1612(CONCAT412(uStack_5c + 0.0,
                         CONCAT48(uStack_60 + 0.0,CONCAT44(uStack_64 + 0.0,local_68 + 0.01))),4);
  auVar8._0_4_ = local_68 + 0.0;
  p_02.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar8._0_8_;
  p_02.super_Tuple3<pbrt::Point3,_float>.z = p.super_Tuple3<pbrt::Point3,_float>.z + 0.01;
  FVar7 = Noise(in_RDI,p_02);
  auVar3._4_4_ = extraout_XMM0_Db;
  auVar3._0_4_ = FVar5;
  auVar3._8_4_ = extraout_XMM0_Dc;
  auVar3._12_4_ = extraout_XMM0_Dd;
  auVar10._4_4_ = FVar4;
  auVar10._0_4_ = FVar4;
  auVar10._8_4_ = FVar4;
  auVar10._12_4_ = FVar4;
  VVar11.super_Tuple3<pbrt::Vector3,_float>.z = (FVar7 - FVar4) / 0.01;
  auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)FVar6),0x10);
  auVar3 = vsubps_avx(auVar3,auVar10);
  auVar2._8_4_ = 0x3c23d70a;
  auVar2._0_8_ = 0x3c23d70a3c23d70a;
  auVar2._12_4_ = 0x3c23d70a;
  auVar3 = vdivps_avx512vl(auVar3,auVar2);
  VVar11.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar3._0_8_;
  return (Vector3f)VVar11.super_Tuple3<pbrt::Vector3,_float>;
}

Assistant:

Vector3f DNoise(Point3f p) {
    Float delta = .01f;
    Float n = Noise(p);
    Point3f noiseDelta(Noise(p + Vector3f(delta, 0, 0)), Noise(p + Vector3f(0, delta, 0)),
                       Noise(p + Vector3f(0, 0, delta)));
    return (noiseDelta - Point3f(n, n, n)) / delta;
}